

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O1

bool __thiscall Protocol::MQTT::V5::WillMessage::check(WillMessage *this)

{
  ushort uVar1;
  PropertyBase *pPVar2;
  int iVar3;
  
  uVar1 = (this->willProperties).length.size;
  if ((((3 < (ushort)(uVar1 - 1)) ||
       ((char)(this->willProperties).length.field_0.value[uVar1 - 1] < '\0')) ||
      (pPVar2 = (this->willProperties).head, pPVar2 == (PropertyBase *)0x0)) ||
     (iVar3 = (*(pPVar2->super_Serializable)._vptr_Serializable[4])(), (char)iVar3 != '\0')) {
    for (pPVar2 = (this->willProperties).head; pPVar2 != (PropertyBase *)0x0; pPVar2 = pPVar2->next)
    {
      if ((byte)(pPVar2->type - 0x2b) < 0xd6) {
        return false;
      }
      if ((0x7dfff7ffe78U >> ((ulong)(pPVar2->type - 1) & 0x3f) & 1) != 0) {
        return false;
      }
    }
    if (((this->willTopic).data == (char *)0x0) != ((this->willTopic).length != 0)) {
      return ((this->willPayload).length != 0) != ((this->willPayload).data == (uint8 *)0x0);
    }
  }
  return false;
}

Assistant:

bool check() const
                {
                    if (!willProperties.check()) return false;
                    PropertyBase * u = willProperties.head;
                    while (u)
                    {   // Will properties are noted as if their control packet type was 0 (since it's reserved, let's use it)
                        if (!isAllowedProperty((PropertyType)u->type, (ControlPacketType)0)) return false;
                        u = u->next;
                    }
                    return willTopic.check() && willPayload.check();
                }